

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_InitGetElemI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  ValidateRegValue(this,*(Var *)(this + (ulong)playout->Instance * 8 + 0x160),false,true);
}

Assistant:

void InterpreterStackFrame::OP_InitGetElemI(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitElemGetter(
            GetReg(playout->Instance),
            GetReg(playout->Element),
            GetReg(playout->Value),
            m_functionBody->GetScriptContext()
        );
    }